

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent-client.c
# Opt level: O1

_Bool agent_try_read(agent_pending_query *conn)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ssize_t sVar4;
  char *pcVar5;
  uint8_t *p;
  
  sVar4 = read(conn->fd,conn->retbuf + conn->retlen,(long)conn->retsize - (long)conn->retlen);
  if ((int)sVar4 < 1) {
    if (conn->retbuf != conn->sizebuf) {
      safefree(conn->retbuf);
    }
LAB_0011a7b5:
    conn->retbuf = (char *)0x0;
    conn->retlen = 0;
    bVar1 = true;
  }
  else {
    iVar2 = (int)sVar4 + conn->retlen;
    conn->retlen = iVar2;
    if ((conn->retsize == 4) && (iVar2 == 4)) {
      uVar3 = *(uint *)conn->retbuf;
      uVar3 = (uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18) + 4;
      conn->retsize = uVar3;
      if ((int)uVar3 < 1) goto LAB_0011a7b5;
      if (conn->retbuf != conn->sizebuf) {
        __assert_fail("conn->retbuf == conn->sizebuf",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/agent-client.c"
                      ,0x52,"_Bool agent_try_read(agent_pending_query *)");
      }
      pcVar5 = (char *)safemalloc((ulong)uVar3,1,0);
      conn->retbuf = pcVar5;
      *(undefined4 *)pcVar5 = *(undefined4 *)conn->sizebuf;
    }
    bVar1 = conn->retsize <= conn->retlen;
  }
  return bVar1;
}

Assistant:

static bool agent_try_read(agent_pending_query *conn)
{
    int ret;

    ret = read(conn->fd, conn->retbuf+conn->retlen,
               conn->retsize-conn->retlen);
    if (ret <= 0) {
        if (conn->retbuf != conn->sizebuf) sfree(conn->retbuf);
        conn->retbuf = NULL;
        conn->retlen = 0;
        return true;
    }
    conn->retlen += ret;
    if (conn->retsize == 4 && conn->retlen == 4) {
        conn->retsize = toint(GET_32BIT_MSB_FIRST(conn->retbuf) + 4);
        if (conn->retsize <= 0) {
            conn->retbuf = NULL;
            conn->retlen = 0;
            return true;                 /* way too large */
        }
        assert(conn->retbuf == conn->sizebuf);
        conn->retbuf = snewn(conn->retsize, char);
        memcpy(conn->retbuf, conn->sizebuf, 4);
    }

    if (conn->retlen < conn->retsize)
        return false;                  /* more data to come */

    return true;
}